

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  long lVar1;
  _Bool _Var2;
  long lVar3;
  long lVar4;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    lVar4 = (long)(r->high_low_container).size;
    if (lVar4 <= lVar3) break;
    _Var2 = container_iterate64((r->high_low_container).containers[lVar3],
                                (r->high_low_container).typecodes[lVar3],
                                (uint)(r->high_low_container).keys[lVar3] << 0x10,iterator,high_bits
                                ,ptr);
    lVar1 = lVar3 + 1;
  } while (_Var2);
  return lVar4 <= lVar3;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(ra->containers[i], ra->typecodes[i],
                                 ((uint32_t)ra->keys[i]) << 16, iterator,
                                 high_bits, ptr)) {
            return false;
        }
    return true;
}